

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoleculeStamp.hpp
# Opt level: O1

bool __thiscall
OpenMD::MoleculeStamp::
addIndexSensitiveStamp<std::vector<OpenMD::AtomStamp*,std::allocator<OpenMD::AtomStamp*>>,OpenMD::AtomStamp>
          (MoleculeStamp *this,
          vector<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_> *cont,AtomStamp *stamp)

{
  pointer ppAVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  value_type local_20;
  
  uVar4 = (ulong)(uint)stamp->index_;
  ppAVar1 = (cont->super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  lVar2 = (long)(cont->super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)ppAVar1;
  uVar3 = lVar2 >> 3;
  if (uVar3 < stamp->index_ + 1) {
    local_20 = (value_type)0x0;
    std::vector<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>::_M_fill_insert
              (cont,(AtomStamp **)((long)ppAVar1 + lVar2),(uVar4 - uVar3) + 1,&local_20);
    ppAVar1 = (cont->super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>).
              _M_impl.super__Vector_impl_data._M_start;
  }
  else if (ppAVar1[uVar4] != (AtomStamp *)0x0) {
    return false;
  }
  ppAVar1[uVar4] = stamp;
  return true;
}

Assistant:

bool addIndexSensitiveStamp(Cont& cont, T* stamp) {
      // typename Cont::iterator i;
      unsigned int index = stamp->getIndex();
      bool ret           = false;
      size_t size        = cont.size();

      if (size >= index + 1) {
        if (cont[index] != NULL) {
          ret = false;
        } else {
          cont[index] = stamp;
          ret         = true;
        }
      } else {
        cont.insert(cont.end(), index - cont.size() + 1, NULL);
        cont[index] = stamp;
        ret         = true;
      }

      return ret;
    }